

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool is_top_level)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  anon_class_32_4_9609453f body;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar4;
  anon_unknown_4 *paVar5;
  Msg *msg_00;
  bool bVar6;
  bool bVar7;
  MessageType MVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t *psVar12;
  Field pFVar13;
  size_t sVar14;
  anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
  aVar15;
  Status SVar16;
  Field pFVar17;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  uintptr_t uVar18;
  uintptr_t extraout_RAX_01;
  uintptr_t extraout_RAX_02;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar19;
  uintptr_t extraout_RAX_03;
  JsonWriter *pJVar20;
  uintptr_t extraout_RAX_04;
  ulong uVar21;
  byte bVar22;
  size_t sVar23;
  char *pcVar24;
  undefined8 uVar25;
  uint uVar26;
  anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
  *this_00;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  string_view name;
  anon_class_16_2_3789d670 body_00;
  anon_class_16_2_3789d670 body_01;
  bool has_value;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  StatusOr<int> nanos;
  bool first;
  Field value_field;
  undefined1 local_131;
  anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
  local_130;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_128;
  ulong uStack_120;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_118;
  ulong uStack_110;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_108;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_100;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_f8;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *pMStack_f0;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_e8;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_e0;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_d8;
  code *local_d0;
  ulong local_c8;
  code *local_c0;
  ulong local_b8;
  code *local_b0;
  ulong local_a8;
  code *local_a0;
  ulong local_98;
  code *local_90;
  long local_88;
  code *local_80;
  ulong local_78;
  code *local_70;
  anon_unknown_4 *local_68;
  Msg *local_60;
  size_t local_58;
  string *local_50;
  Field local_48;
  Field local_40;
  char *local_38;
  
  psVar12 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)msg;
  name._M_len = *psVar12;
  MVar8 = ClassifyMessage((json_internal *)psVar12[1],name);
  switch(MVar8) {
  case kAny:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    pFVar13 = Proto3Type::MustHaveField(desc,2);
    local_40 = pFVar13;
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    sVar14 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    local_131 = sVar14 != 0;
    if (sVar14 == 0 && sVar23 == 0) {
      pcVar24 = "{}";
      sVar23 = 2;
      break;
    }
    if (sVar23 == 0) {
      pcVar24 = "broken Any: missing type URL";
      uVar25 = 0x1c;
LAB_002cc2a7:
      uVar18 = absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
      return (Status)uVar18;
    }
    if ((sVar14 == 0) && ((writer->options_).allow_legacy_syntax == false)) {
      pcVar24 = "broken Any: missing value";
      uVar25 = 0x19;
      goto LAB_002cc2a7;
    }
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    UnparseProto3Type::GetString
              ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &local_130.status_,pFVar17,&writer->scratch_buf_,msg,0);
    *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
      *)this = local_130;
    aVar15 = local_130;
    if (((ulong)local_130 & 1) == 0) {
      LOCK();
      *(int *)local_130 = *(int *)local_130 + 1;
      UNLOCK();
      aVar15.status_.rep_ = *(Status *)this;
    }
    if (aVar15 != (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                   )0x1) {
LAB_002cb5a1:
      this_00 = &local_130;
      goto LAB_002cbc6c;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    JsonWriter::NewLine(writer);
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
    if ((writer->options_).add_whitespace == true) {
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
    }
    if (local_130 !=
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) goto LAB_002cc53e;
    local_118 = local_128;
    uStack_110 = uStack_120;
    JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
              (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &local_118.status_);
    if (local_130 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) {
      local_e8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,uStack_120,uStack_120 + (long)local_128);
      local_108 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_131;
      aStack_100 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_40;
      body.value_field = (Field *)aStack_100;
      body.has_value = (bool *)local_108;
      body.writer = writer;
      body.msg = msg;
      local_f8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)writer;
      pMStack_f0 = msg;
      Proto3Type::
      WithDynamicType<google::protobuf::json_internal::(anonymous_namespace)::WriteAny<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_1_>
                ((Desc *)this,(string *)desc,body);
      if (local_e8 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_d8) {
        operator_delete((void *)local_e8,(long)aStack_d8 + 1);
      }
      goto LAB_002cb5a1;
    }
    goto LAB_002cc548;
  case kWrapper:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 == 0) {
      SVar16 = WriteSingular<google::protobuf::json_internal::UnparseProto3Type>
                         (this,writer,pFVar17);
      return (Status)SVar16.rep_;
    }
    SVar16 = (anonymous_namespace)::
             WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                       ((_anonymous_namespace_ *)this,writer,pFVar17,msg);
    return (Status)SVar16.rep_;
  case kStruct:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    SVar16 = WriteMap<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,pFVar17);
    return (Status)SVar16.rep_;
  case kList:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    SVar16 = WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>
                       (this,writer,msg,pFVar17);
    return (Status)SVar16.rep_;
  case kValue:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 != 0) {
      pcVar24 = "null";
      sVar23 = 4;
      break;
    }
    pFVar17 = Proto3Type::MustHaveField(desc,2);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 == 0) {
      pFVar17 = Proto3Type::MustHaveField(desc,3);
      sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
      if (sVar23 != 0) {
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e8.status_,pFVar17,&writer->scratch_buf_,msg,0);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_e8;
        aVar19 = local_e8;
        if (((ulong)local_e8 & 1) == 0) {
          LOCK();
          *(int *)local_e8 = *(int *)local_e8 + 1;
          UNLOCK();
          aVar19.status_.rep_ = *(Status *)this;
        }
        if (aVar19 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
LAB_002cbc64:
          this_00 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                     *)&local_e8;
LAB_002cbc6c:
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     &this_00->status_);
          return (Status)extraout_RAX_00;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        if (local_e8 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          local_108 = local_e0;
          aStack_100 = aStack_d8;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &local_108.status_);
          *(undefined8 *)this = 1;
          goto LAB_002cbc64;
        }
        goto LAB_002cc55f;
      }
      pFVar17 = Proto3Type::MustHaveField(desc,4);
      sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
      if (sVar23 == 0) {
        pJVar20 = (JsonWriter *)Proto3Type::MustHaveField(desc,5);
        sVar23 = UntypedMessage::Count
                           (msg,(((Field *)(pJVar20->sink_).buffer_)->field_0)._impl_.number_);
        if (sVar23 != 0) {
          UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_e8.status_,(Field)pJVar20,msg,0)
          ;
          *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_e8;
          if (((ulong)local_e8 & 1) == 0) {
            LOCK();
            *(int *)local_e8 = *(int *)local_e8 + 1;
            UNLOCK();
            local_e8.status_.rep_ = *(Status *)this;
          }
          if (local_e8 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            body_00.x = (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)writer;
            body_00.writer = pJVar20;
            Proto3Type::
            WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_1_>
                      ((Field)this,body_00);
          }
LAB_002cc4a1:
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                    ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                     &local_e8.status_);
          return (Status)extraout_RAX_04;
        }
        pJVar20 = (JsonWriter *)Proto3Type::MustHaveField(desc,6);
        sVar23 = UntypedMessage::Count
                           (msg,(((Field *)(pJVar20->sink_).buffer_)->field_0)._impl_.number_);
        if (sVar23 != 0) {
          UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_e8.status_,(Field)pJVar20,msg,0)
          ;
          *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_e8;
          if (((ulong)local_e8 & 1) == 0) {
            LOCK();
            *(int *)local_e8 = *(int *)local_e8 + 1;
            UNLOCK();
            local_e8.status_.rep_ = *(Status *)this;
          }
          if (local_e8 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            body_01.x = (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)writer;
            body_01.writer = pJVar20;
            Proto3Type::
            WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_2_>
                      ((Field)this,body_01);
          }
          goto LAB_002cc4a1;
        }
        uVar18 = 0;
        if (!is_top_level) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                     ,0x22b,0xc,"is_top_level");
          absl::lts_20240722::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                    (&local_e8,0x81,
                     "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                    );
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_e8.status_);
        }
        goto LAB_002cbb80;
      }
      UnparseProto3Type::GetBool((UnparseProto3Type *)&local_e8.status_,pFVar17,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_e8;
      aVar19 = local_e8;
      if (((ulong)local_e8 & 1) == 0) {
        LOCK();
        *(int *)local_e8 = *(int *)local_e8 + 1;
        UNLOCK();
        aVar19.status_.rep_ = *(Status *)this;
      }
      if (aVar19 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
LAB_002cc3a5:
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_e8.status_);
        return (Status)extraout_RAX_03;
      }
      absl::lts_20240722::Status::~Status((Status *)this);
      if (local_e8 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        pcVar24 = "false";
        if (((ulong)local_e0 & 0xff) != 0) {
          pcVar24 = "true";
        }
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                  (&writer->sink_,pcVar24,(ulong)local_e0 & 0xff ^ 5);
        *(undefined8 *)this = 1;
        goto LAB_002cc3a5;
      }
      goto LAB_002cc56c;
    }
    UnparseProto3Type::GetDouble((UnparseProto3Type *)&local_e8.status_,pFVar17,msg,0);
    *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_e8;
    aVar19 = local_e8;
    if (((ulong)local_e8 & 1) == 0) {
      LOCK();
      *(int *)local_e8 = *(int *)local_e8 + 1;
      UNLOCK();
      aVar19.status_.rep_ = *(Status *)this;
    }
    if (aVar19 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002cc2bd;
    absl::lts_20240722::Status::~Status((Status *)this);
    if (local_e8 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002cc552;
    if (NAN((double)local_e0)) goto LAB_002cc579;
    if (((ulong)local_e0 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
      JsonWriter::Write(writer,(double)local_e0);
      *(undefined8 *)this = 1;
      goto LAB_002cc2bd;
    }
    pcVar24 = 
    "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
    ;
    uVar25 = 0x66;
    goto LAB_002cbc3e;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    local_e8.status_.rep_._0_1_ = 1;
    SVar16 = WriteFields<google::protobuf::json_internal::UnparseProto3Type>
                       (this,writer,msg,desc,(bool *)&local_e8);
    if (*(long *)this != 1) {
      return (Status)SVar16.rep_;
    }
    writer->indent_ = writer->indent_ + -1;
    if (local_e8.status_.rep_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar24 = "}";
    sVar23 = 1;
    break;
  case kTimestamp:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 != 0) {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_130.status_,pFVar17,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
        *)this = local_130;
      if (((ulong)local_130 & 1) == 0) {
        LOCK();
        *(int *)local_130 = *(int *)local_130 + 1;
        UNLOCK();
      }
      if (local_130 !=
          (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
           )0x1) goto LAB_002cc2ea;
      if ((long)local_128 < -0xe7791f700) {
        pcVar24 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
      }
      else {
        if ((long)local_128 < 0x3afff44180) goto LAB_002cba44;
        pcVar24 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
      }
      absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar24);
      goto LAB_002cc2ea;
    }
    local_130 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                 )0x1;
    *(undefined8 *)this = 1;
    local_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
LAB_002cba44:
    local_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)local_128 + 0xe7791f700);
    pFVar17 = Proto3Type::MustHaveField(desc,2);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 == 0) {
      uStack_110 = uStack_110 & 0xffffffff00000000;
      local_118 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
      *(undefined8 *)this = 1;
    }
    else {
      UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_118.status_,pFVar17,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_118;
      if (((ulong)local_118 & 1) == 0) {
        LOCK();
        *(int *)local_118 = *(int *)local_118 + 1;
        UNLOCK();
      }
      if (local_118 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002cc2e0;
    }
    if (local_130 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) {
      iVar11 = (int)(SUB168(SEXT816((long)local_128) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
      iVar27 = SUB164(SEXT816((long)local_128) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
      iVar3 = ((iVar11 - iVar27) * 4 + 0x6d40ac) / 0x23ab1;
      iVar9 = iVar3 * 0x23ab1;
      iVar10 = iVar9 + 3;
      iVar9 = iVar9 + 6;
      if (-1 < iVar10) {
        iVar9 = iVar10;
      }
      iVar27 = ((iVar11 - iVar27) + 0x1b502b) - (iVar9 >> 2);
      iVar10 = iVar27 * 4000;
      iVar10 = (int)((ulong)((long)(iVar10 + 4000) * -0x48441d23) >> 0x20) + iVar10 + 4000;
      iVar9 = (iVar10 >> 0x14) - (iVar10 >> 0x1f);
      iVar11 = iVar9 * 0x5b5;
      iVar10 = iVar11 + 3;
      if (-1 < iVar11) {
        iVar10 = iVar11;
      }
      lVar30 = (long)local_128 / 0xe10;
      if (local_118 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        iVar27 = (iVar27 - (iVar10 >> 2)) + 0x1f;
        iVar10 = iVar27 * 0x50;
        iVar11 = iVar10 / 0x98f;
        iVar31 = (int)((ulong)((long)(iVar11 * 0x98f) * -0x66666667) >> 0x20);
        uVar28 = (iVar27 - (iVar31 >> 0x1f)) + (iVar31 >> 5);
        iVar10 = iVar10 / 0x6925;
        aStack_d8.status_.rep_._0_4_ = iVar11 + iVar10 * -0xc + 2;
        uVar26 = (iVar3 * 100 + iVar9 + iVar10) - 0x1324;
        local_a8 = ((long)local_128 / 0x3c) % 0x3c;
        local_b8 = lVar30 + (((ulong)(lVar30 / 6 + (lVar30 >> 0x3f)) >> 2) - (lVar30 >> 0x3f)) *
                            -0x18;
        if ((uint)uStack_110 == 0) {
          local_e8.status_.rep_._4_4_ = 0;
          local_e8.status_.rep_._0_4_ = uVar26;
          local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                     absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          aStack_d8.status_.rep_._4_4_ = 0;
          local_d0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_c8 = (ulong)uVar28;
          local_c0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b8 = local_b8 & 0xffffffff;
          local_b0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_a8 = local_a8 & 0xffffffff;
          local_a0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_98 = (long)local_128 % 0x3c & 0xffffffff;
          local_90 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_108,"\"%04d-%02d-%02dT%02d:%02d:%02dZ\"",0x20,&local_e8,6);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_108,(size_t)aStack_100);
        }
        else {
          uVar2 = -(uint)uStack_110;
          if (0 < (int)(uint)uStack_110) {
            uVar2 = (uint)uStack_110;
          }
          local_88 = 9;
          uVar29 = uVar2 * 0x26e978d5 >> 3 | uVar2 * -0x60000000;
          local_78 = (ulong)uVar2;
          while (uVar29 < 0x418938) {
            local_88 = local_88 + -3;
            iVar10 = (int)(local_78 / 1000);
            local_78 = local_78 / 1000;
            uVar29 = (uint)(iVar10 * 0x26e978d5) >> 3 | iVar10 * -0x60000000;
          }
          local_e8.status_.rep_._4_4_ = 0;
          local_e8.status_.rep_._0_4_ = uVar26;
          local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                     absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          aStack_d8.status_.rep_._4_4_ = 0;
          local_d0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_c8 = (ulong)uVar28;
          local_c0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_b8 = local_b8 & 0xffffffff;
          local_b0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_a8 = local_a8 & 0xffffffff;
          local_a0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_98 = (long)local_128 % 0x3c & 0xffffffff;
          local_90 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_80 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          ;
          local_70 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_108,"\"%04d-%02d-%02dT%02d:%02d:%02d.%.*dZ\"",0x25,&local_e8,8);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_108,(size_t)aStack_100);
        }
LAB_002cc277:
        aVar19 = local_108;
        if (local_108 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_f8) {
LAB_002cc28a:
          operator_delete((void *)aVar19,(long)local_f8 + 1);
        }
LAB_002cc292:
        *(undefined8 *)this = 1;
        goto LAB_002cc2e0;
      }
    }
    else {
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_130.status_);
    }
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_118.status_);
    goto LAB_002cc531;
  case kDuration:
    pFVar17 = Proto3Type::MustHaveField(desc,1);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 == 0) {
      local_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
      local_130 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                   )0x1;
      *(undefined8 *)this = 1;
    }
    else {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_130.status_,pFVar17,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
        *)this = local_130;
      if (((ulong)local_130 & 1) == 0) {
        LOCK();
        *(int *)local_130 = *(int *)local_130 + 1;
        UNLOCK();
      }
      if (local_130 !=
          (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
           )0x1) goto LAB_002cc2ea;
      if ((long)local_128 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
        absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
        goto LAB_002cc2ea;
      }
    }
    pFVar17 = Proto3Type::MustHaveField(desc,2);
    sVar23 = UntypedMessage::Count(msg,(pFVar17->raw_->field_0)._impl_.number_);
    if (sVar23 != 0) {
      UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_118.status_,pFVar17,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_118;
      if (((ulong)local_118 & 1) == 0) {
        LOCK();
        *(int *)local_118 = *(int *)local_118 + 1;
        UNLOCK();
      }
      if (local_118 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        uVar21 = uStack_110 & 0xffffffff;
        if (0x88ca6c00 < (uint)uStack_110 + 0xc4653600) goto LAB_002cbc9e;
        pcVar24 = "duration out of range";
        uVar25 = 0x15;
LAB_002cc2d8:
        absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
      }
LAB_002cc2e0:
      absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                ((StatusOrData<int> *)&local_118.status_);
LAB_002cc2ea:
      absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                ((StatusOrData<long> *)&local_130.status_);
      return (Status)extraout_RAX_02;
    }
    uStack_110 = uStack_110 & 0xffffffff00000000;
    local_118 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
    *(undefined8 *)this = 1;
    uVar21 = 0;
LAB_002cbc9e:
    if (local_130 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) {
      iVar10 = (int)uVar21;
      if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
LAB_002cbcd0:
        if (iVar10 != 0) {
          local_b8 = (ulong)(uint)-iVar10;
          if (0 < iVar10) {
            local_b8 = uVar21;
          }
          local_c8 = 9;
          uVar26 = (uint)((int)local_b8 * 0x26e978d5) >> 3 | (int)local_b8 * -0x60000000;
          while (uVar26 < 0x418938) {
            local_c8 = local_c8 - 3;
            iVar11 = (int)(local_b8 / 1000);
            local_b8 = local_b8 / 1000;
            uVar26 = (uint)(iVar11 * 0x26e978d5) >> 3 | iVar11 * -0x60000000;
          }
          local_38 = "";
          if (iVar10 < 0 || (long)local_128 < 0) {
            local_38 = "-";
          }
          local_40 = (Field)(ulong)(iVar10 < 0 || (long)local_128 < 0);
          local_e8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_40;
          aStack_d8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)-(long)local_128;
          if (0 < (long)local_128) {
            aStack_d8 = local_128;
          }
          local_e0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                     absl::lts_20240722::str_format_internal::FormatArgImpl::
                     Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          local_d0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
          local_c0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          ;
          local_b0 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_108,"\"%s%d.%.*ds\"",0xc,&local_e8,4);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_108,(size_t)aStack_100);
          goto LAB_002cc277;
        }
      }
      else if (iVar10 != 0) {
        if ((int)(uVar21 >> 0x1f) != -(local_128._4_4_ >> 0x1f)) {
          pcVar24 = "nanos and seconds signs do not match";
          uVar25 = 0x24;
          goto LAB_002cc2d8;
        }
        goto LAB_002cbcd0;
      }
      local_108.status_.rep_ = (Status)(Status)local_128;
      aStack_100 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
      absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                (&local_e8,"\"%ds\"",5,&local_108,1);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                (&writer->sink_,(char *)local_e8,(size_t)local_e0);
      local_f8 = aStack_d8;
      aVar19 = local_e8;
      if (local_e8 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_d8)
      goto LAB_002cc28a;
      goto LAB_002cc292;
    }
LAB_002cc531:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_130.status_);
LAB_002cc53e:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_130.status_);
LAB_002cc548:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_130.status_);
LAB_002cc552:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_e8.status_);
LAB_002cc55f:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_e8.status_);
LAB_002cc56c:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_e8.status_);
LAB_002cc579:
    pcVar24 = 
    "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
    ;
    uVar25 = 0x61;
LAB_002cbc3e:
    absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
LAB_002cc2bd:
    absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
              ((StatusOrData<double> *)&local_e8.status_);
    return (Status)extraout_RAX_01;
  case kFieldMask:
    local_48 = Proto3Type::MustHaveField(desc,1);
    sVar23 = UntypedMessage::Count(msg,(local_48->raw_->field_0)._impl_.number_);
    local_e8.status_.rep_._0_1_ = 0x22;
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,(char *)&local_e8,1);
    local_58 = sVar23;
    if (sVar23 != 0) {
      local_50 = &writer->scratch_buf_;
      bVar7 = true;
      sVar23 = 0;
      local_68 = this;
      local_60 = msg;
      do {
        msg_00 = local_60;
        paVar5 = local_68;
        if (!bVar7) {
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
        }
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e8.status_,local_48,local_50,msg_00,sVar23);
        aVar4 = aStack_d8;
        aVar19 = local_e0;
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)&paVar5->field_0x0 = (Status)local_e8;
        if (((ulong)local_e8 & 1) == 0) {
          LOCK();
          *(int *)local_e8 = *(int *)local_e8 + 1;
          UNLOCK();
        }
        if (local_e8 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002cbc64;
        if (local_e0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
          lVar30 = 0;
          bVar7 = false;
          do {
            bVar1 = *(byte *)((long)aVar4 + lVar30);
            if ((byte)(bVar1 + 0x9f) < 0x1a) {
              if (bVar7) {
                local_108.status_.rep_._0_1_ =
                     *(undefined1 *)
                      ((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)bVar1);
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_108,1);
              }
              else {
LAB_002cb8d5:
                local_108.status_.rep_._0_1_ = bVar1;
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_108,1);
              }
LAB_002cb937:
              bVar6 = false;
            }
            else {
              if (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10) goto LAB_002cb8d5;
              if (bVar1 != 0x5f) {
                bVar22 = (writer->options_).allow_legacy_syntax;
LAB_002cb901:
                if ((bVar22 & 1) != 0) {
                  if (bVar7) {
                    local_108.status_.rep_._0_1_ = 0x5f;
                    io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                              (&writer->sink_,(char *)&local_108,1);
                  }
                  local_108.status_.rep_._0_1_ = bVar1;
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,(char *)&local_108,1);
                  goto LAB_002cb937;
                }
                absl::lts_20240722::InvalidArgumentError
                          (local_68,0x21,"unexpected character in FieldMask");
                goto LAB_002cbc64;
              }
              bVar6 = true;
              if ((bVar7) &&
                 (bVar22 = (writer->options_).allow_legacy_syntax, (bool)bVar22 == false))
              goto LAB_002cb901;
            }
            bVar7 = bVar6;
            lVar30 = lVar30 + 1;
          } while (aVar19 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)lVar30);
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_e8.status_);
        sVar23 = sVar23 + 1;
        bVar7 = false;
        this = local_68;
      } while (sVar23 != local_58);
    }
    pcVar24 = (char *)&local_e8;
    local_e8.status_.rep_._0_1_ = 0x22;
    sVar23 = 1;
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar24,sVar23);
  uVar18 = extraout_RAX;
LAB_002cbb80:
  *(undefined8 *)this = 1;
  return (Status)uVar18;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}